

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void highs::parallel::for_each<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__1&>
               (HighsInt start,HighsInt end,anon_class_32_4_b1b9b1f6 *f,HighsInt grainSize)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  HighsSplitDeque *pHVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  uint32_t uVar7;
  int start_00;
  TaskGroup tg;
  TaskGroup local_40;
  
  if (end - start <= grainSize) {
    HEkkDual::chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(f,start,end);
    return;
  }
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  plVar5 = (long *)__tls_get_addr(&PTR_00441ef0);
  local_40.workerDeque = (HighsSplitDeque *)*plVar5;
  local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
  do {
    pHVar3 = local_40.workerDeque;
    start_00 = start + end >> 1;
    uVar4 = ((local_40.workerDeque)->ownerData).head;
    uVar6 = (ulong)uVar4;
    if (uVar6 < 0x2000) {
      uVar7 = (uint32_t)(uVar6 + 1);
      ((local_40.workerDeque)->ownerData).head = uVar7;
      ((local_40.workerDeque)->taskArray)._M_elems[uVar6].metadata.stealer.
      super___atomic_base<unsigned_long>._M_i = 0;
      *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar6].taskData =
           &PTR_operator___004413e8;
      *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar6].taskData + 8) = start_00;
      *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar6].taskData + 0xc) = end;
      *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar6].taskData + 0x10) = grainSize
      ;
      *(anon_class_32_4_b1b9b1f6 **)
       (((local_40.workerDeque)->taskArray)._M_elems[uVar6].taskData + 0x18) = f;
      if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
        ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
             uVar6 << 0x20 | uVar6 + 1;
        ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
        ((local_40.workerDeque)->ownerData).splitCopy = uVar7;
        ((local_40.workerDeque)->ownerData).allStolenCopy = false;
        if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
          ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
        }
        peVar2 = ((local_40.workerDeque)->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        LOCK();
        _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
        (peVar2->haveJobs).super___atomic_base<int>._M_i =
             (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if (_Var1._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
          HighsSplitDeque::WorkerBunk::publishWork
                    (((local_40.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_40.workerDeque);
        }
      }
      else {
        HighsSplitDeque::growShared(local_40.workerDeque);
      }
    }
    else {
      if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
         (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
        HighsSplitDeque::growShared(local_40.workerDeque);
        uVar4 = (pHVar3->ownerData).head;
      }
      (pHVar3->ownerData).head = uVar4 + 1;
      for_each<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__1&>(start_00,end,f,grainSize);
    }
    end = start_00;
  } while (grainSize < start_00 - start);
  HEkkDual::chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(f,start,start_00);
  TaskGroup::taskWait(&local_40);
  TaskGroup::~TaskGroup(&local_40);
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}